

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.cpp
# Opt level: O1

void __thiscall SGParser::Generator::NFA::MoveData(NFA *this,NFA *source)

{
  pointer ppNVar1;
  
  Destroy(this);
  this->pStartState = source->pStartState;
  std::vector<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>::
  operator=(&this->FinalState,&source->FinalState);
  source->pStartState = (NFANode *)0x0;
  ppNVar1 = (source->FinalState).
            super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((source->FinalState).
      super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppNVar1) {
    (source->FinalState).
    super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppNVar1;
  }
  return;
}

Assistant:

void NFA::MoveData(NFA& source) {
    // Destroy this NFA's data if it exists
    Destroy();

    // Move data
    pStartState = source.pStartState;
    FinalState  = source.FinalState;

    // And empty out source
    source.pStartState = nullptr;
    source.FinalState.clear();
}